

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::arraypool::poolinit(arraypool *this,int sizeofobject,int log2objperblk)

{
  int local_24;
  int log2objperblk_local;
  int sizeofobject_local;
  arraypool *this_local;
  
  local_24 = sizeofobject;
  if (sizeofobject < 2) {
    local_24 = 1;
  }
  this->objectbytes = local_24;
  this->log2objectsperblock = log2objperblk;
  this->objectsperblock = 1 << ((byte)this->log2objectsperblock & 0x1f);
  this->objectsperblockmark = this->objectsperblock + -1;
  this->totalmemory = 0;
  this->toparray = (char **)0x0;
  this->toparraylen = 0;
  restart(this);
  return;
}

Assistant:

void tetgenmesh::arraypool::poolinit(int sizeofobject, int log2objperblk)
{
  // Each object must be at least one byte long.
  objectbytes = sizeofobject > 1 ? sizeofobject : 1;

  log2objectsperblock = log2objperblk;
  // Compute the number of objects in each block.
  objectsperblock = ((int) 1) << log2objectsperblock;
  objectsperblockmark = objectsperblock - 1;

  // No memory has been allocated.
  totalmemory = 0l;
  // The top array has not been allocated yet.
  toparray = (char **) NULL;
  toparraylen = 0;

  // Ready all indices to be allocated.
  restart();
}